

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O1

void __thiscall serialize_tests::vector_bool::test_method(vector_bool *this)

{
  void *pvVar1;
  int iVar2;
  HashWriter *pHVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  initializer_list<unsigned_char> __l;
  initializer_list<bool> __l_00;
  const_string file;
  _Bit_iterator __first;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  _Bit_iterator __last;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vec1;
  vector<bool,_std::allocator<bool>_> vec2;
  check_type cVar8;
  char *local_220;
  char *local_218;
  lazy_ostream local_210;
  undefined1 *local_200;
  char **local_1f8;
  assertion_result local_1f0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  vector<bool,_std::allocator<bool>_> local_170;
  undefined1 local_148 [16];
  shared_count sStack_138;
  uint32_t auStack_130 [2];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  uint64_t local_e8;
  undefined1 local_d8 [9];
  uchar uStack_cf;
  uchar uStack_ce;
  uchar uStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  uchar uStack_c9;
  uchar local_c8;
  uchar uStack_c7;
  uchar uStack_c6;
  uchar uStack_c5;
  uchar uStack_c4;
  uchar uStack_c3;
  uchar uStack_c2;
  uchar uStack_c1;
  uchar uStack_c0;
  uchar uStack_bf;
  uchar uStack_be;
  uchar uStack_bd;
  uchar uStack_bc;
  uchar uStack_bb;
  uchar uStack_ba;
  uchar uStack_b9;
  undefined1 local_b8 [9];
  undefined2 uStack_af;
  undefined5 uStack_ad;
  undefined3 uStack_a8;
  uint32_t uStack_a5;
  undefined3 uStack_a0;
  uint32_t uStack_9d;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uint64_t local_58;
  uint256 local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_a8 = 0x10000;
  _uStack_a5 = 0x100010101;
  uStack_a0 = 0x10000;
  local_b8._0_8_ = (_func_int **)0x10101000001;
  local_b8[8] = false;
  uStack_af = 0x100;
  uStack_ad = 0x1010000;
  __l._M_len = 0x1b;
  __l._M_array = local_b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_188,__l,(allocator_type *)local_148);
  uStack_a8 = 0x10000;
  _uStack_a5 = 0x100010101;
  uStack_a0 = 0x10000;
  local_b8._0_8_ = (_func_int **)0x10101000001;
  local_b8[8] = false;
  uStack_af = 0x100;
  uStack_ad = 0x1010000;
  __l_00._M_len = 0x1b;
  __l_00._M_array = (iterator)local_b8;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_170,__l_00,(allocator_type *)local_148);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = &DAT_000000c0;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  __last.super__Bit_iterator_base._M_offset =
       local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_p =
       local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<std::_Bit_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,__first,__last,
             (allocator_type *)&local_210);
  pvVar1 = (void *)CONCAT17(local_50.super_base_blob<256U>.m_data._M_elems[7],
                            CONCAT16(local_50.super_base_blob<256U>.m_data._M_elems[6],
                                     CONCAT15(local_50.super_base_blob<256U>.m_data._M_elems[5],
                                              CONCAT14(local_50.super_base_blob<256U>.m_data.
                                                       _M_elems[4],
                                                       CONCAT13(local_50.super_base_blob<256U>.
                                                                m_data._M_elems[3],
                                                                CONCAT12(local_50.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(local_50.super_base_blob<256U>.m_data.
                                                           _M_elems[1],
                                                           local_50.super_base_blob<256U>.m_data.
                                                           _M_elems[0])))))));
  if ((long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
      CONCAT17(local_50.super_base_blob<256U>.m_data._M_elems[0xf],
               CONCAT16(local_50.super_base_blob<256U>.m_data._M_elems[0xe],
                        CONCAT15(local_50.super_base_blob<256U>.m_data._M_elems[0xd],
                                 CONCAT14(local_50.super_base_blob<256U>.m_data._M_elems[0xc],
                                          CONCAT13(local_50.super_base_blob<256U>.m_data._M_elems
                                                   [0xb],CONCAT12(local_50.super_base_blob<256U>.
                                                                  m_data._M_elems[10],
                                                                  CONCAT11(local_50.
                                                  super_base_blob<256U>.m_data._M_elems[9],
                                                  local_50.super_base_blob<256U>.m_data._M_elems[8])
                                                  )))))) - (long)pvVar1) {
    if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_148[0] = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp(local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,pvVar1,
                   (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      local_148[0] = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    local_148[0] = (class_property<bool>)false;
  }
  local_148._8_8_ = (element_type *)0x0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_d8._0_8_ = "vec1 == std::vector<uint8_t>(vec2.begin(), vec2.end())";
  stack0xffffffffffffff30 = "";
  local_b8[8] = false;
  local_b8._0_8_ = &PTR__lazy_ostream_013d3df0;
  uStack_a8 = 0x3e8138;
  _uStack_a5 = 1;
  uStack_a0 = SUB83(local_d8,0);
  _uStack_9d = (undefined5)((ulong)local_d8 >> 0x18);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1b0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_148,(lazy_ostream *)local_b8,1,0,WARN,_cVar8,
             (size_t)&local_1b8,0xc0);
  boost::detail::shared_count::~shared_count(&sStack_138);
  pvVar1 = (void *)CONCAT17(local_50.super_base_blob<256U>.m_data._M_elems[7],
                            CONCAT16(local_50.super_base_blob<256U>.m_data._M_elems[6],
                                     CONCAT15(local_50.super_base_blob<256U>.m_data._M_elems[5],
                                              CONCAT14(local_50.super_base_blob<256U>.m_data.
                                                       _M_elems[4],
                                                       CONCAT13(local_50.super_base_blob<256U>.
                                                                m_data._M_elems[3],
                                                                CONCAT12(local_50.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(local_50.super_base_blob<256U>.m_data.
                                                           _M_elems[1],
                                                           local_50.super_base_blob<256U>.m_data.
                                                           _M_elems[0])))))));
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_50.super_base_blob<256U>.m_data._M_elems._16_8_ - (long)pvVar1);
  }
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xc1;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  uStack_a8 = 0;
  _uStack_a5 = 0;
  uStack_a0 = 0;
  _uStack_9d = 0;
  local_b8._0_8_ = (_func_int **)0x0;
  local_b8[8] = false;
  uStack_af = 0;
  uStack_ad = 0;
  local_58 = 0;
  CSHA256::CSHA256((CSHA256 *)local_b8);
  pHVar3 = HashWriter::operator<<((HashWriter *)local_b8,&local_188);
  HashWriter::GetHash(&local_50,pHVar3);
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  auStack_130[0] = 0;
  auStack_130[1] = 0;
  local_148[0] = (class_property<bool>)0x0;
  local_148._1_7_ = 0;
  local_148._8_8_ = (element_type *)0x0;
  local_e8 = 0;
  CSHA256::CSHA256((CSHA256 *)local_148);
  pHVar3 = HashWriter::operator<<((HashWriter *)local_148,&local_170);
  HashWriter::GetHash((uint256 *)local_d8,pHVar3);
  auVar7[0] = -(local_d8[0] ==
               (vector<unsigned_char,std::allocator<unsigned_char>>)
               local_50.super_base_blob<256U>.m_data._M_elems[0]);
  auVar7[1] = -(local_d8[1] == local_50.super_base_blob<256U>.m_data._M_elems[1]);
  auVar7[2] = -(local_d8[2] == local_50.super_base_blob<256U>.m_data._M_elems[2]);
  auVar7[3] = -(local_d8[3] == local_50.super_base_blob<256U>.m_data._M_elems[3]);
  auVar7[4] = -(local_d8[4] == local_50.super_base_blob<256U>.m_data._M_elems[4]);
  auVar7[5] = -(local_d8[5] == local_50.super_base_blob<256U>.m_data._M_elems[5]);
  auVar7[6] = -(local_d8[6] == local_50.super_base_blob<256U>.m_data._M_elems[6]);
  auVar7[7] = -(local_d8[7] == local_50.super_base_blob<256U>.m_data._M_elems[7]);
  auVar7[8] = -(local_d8[8] == local_50.super_base_blob<256U>.m_data._M_elems[8]);
  auVar7[9] = -(uStack_cf == local_50.super_base_blob<256U>.m_data._M_elems[9]);
  auVar7[10] = -(uStack_ce == local_50.super_base_blob<256U>.m_data._M_elems[10]);
  auVar7[0xb] = -(uStack_cd == local_50.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar7[0xc] = -(uStack_cc == local_50.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar7[0xd] = -(uStack_cb == local_50.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar7[0xe] = -(uStack_ca == local_50.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar7[0xf] = -(uStack_c9 == local_50.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar6[0] = -(local_c8 == local_50.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar6[1] = -(uStack_c7 == local_50.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar6[2] = -(uStack_c6 == local_50.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar6[3] = -(uStack_c5 == local_50.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar6[4] = -(uStack_c4 == local_50.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar6[5] = -(uStack_c3 == local_50.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar6[6] = -(uStack_c2 == local_50.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar6[7] = -(uStack_c1 == local_50.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar6[8] = -(uStack_c0 == local_50.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar6[9] = -(uStack_bf == local_50.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar6[10] = -(uStack_be == local_50.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar6[0xb] = -(uStack_bd == local_50.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar6[0xc] = -(uStack_bc == local_50.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar6[0xd] = -(uStack_bb == local_50.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar6[0xe] = -(uStack_ba == local_50.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar6[0xf] = -(uStack_b9 == local_50.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar6 = auVar6 & auVar7;
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff);
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8 = &local_220;
  local_220 = "(HashWriter{} << vec1).GetHash() == (HashWriter{} << vec2).GetHash()";
  local_218 = "";
  local_210.m_empty = false;
  local_210._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_200 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,&local_210,1,0,WARN,0xf353a0,(size_t)&stack0xfffffffffffffdd0,0xc1);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  if (local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_170.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(vector_bool)
{
    std::vector<uint8_t> vec1{1, 0, 0, 1, 1, 1, 0, 0, 0, 0, 1, 0, 0, 1, 1, 0, 0, 0, 1, 1, 1, 1, 0, 1, 0, 0, 1};
    std::vector<bool> vec2{1, 0, 0, 1, 1, 1, 0, 0, 0, 0, 1, 0, 0, 1, 1, 0, 0, 0, 1, 1, 1, 1, 0, 1, 0, 0, 1};

    BOOST_CHECK(vec1 == std::vector<uint8_t>(vec2.begin(), vec2.end()));
    BOOST_CHECK((HashWriter{} << vec1).GetHash() == (HashWriter{} << vec2).GetHash());
}